

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib537.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = strcmp(URL,"check");
  if (iVar1 == 0) {
    iVar1 = 0;
    iVar2 = rlimit(0);
    if (iVar2 != 0) {
      fprintf(_stdout,"rlimit problem: %s\n",msgbuff);
      iVar1 = 1;
    }
  }
  else {
    iVar2 = rlimit(1);
    iVar1 = 0x7e;
    if (iVar2 == 0) {
      iVar2 = curl_global_init(3);
      if (iVar2 == 0) {
        lVar3 = curl_easy_init();
        if (lVar3 == 0) {
          fwrite("curl_easy_init() failed\n",0x18,1,_stderr);
          close_file_descriptors();
        }
        else {
          iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(lVar3,0x2a,1);
            if (iVar1 == 0) {
              iVar1 = curl_easy_perform(lVar3);
            }
          }
          close_file_descriptors();
          curl_easy_cleanup(lVar3);
        }
        curl_global_cleanup();
      }
      else {
        fwrite("curl_global_init() failed\n",0x1a,1,_stderr);
        close_file_descriptors();
      }
    }
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;

  if(!strcmp(URL, "check")) {
    /* used by the test script to ask if we can run this test or not */
    if(rlimit(FALSE)) {
      fprintf(stdout, "rlimit problem: %s\n", msgbuff);
      return 1;
    }
    return 0; /* sure, run this! */
  }

  if (rlimit(TRUE)) {
    /* failure */
    return TEST_ERR_MAJOR_BAD;
  }

  /* run the test with the bunch of open file descriptors
     and close them all once the test is over */

  if (curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    close_file_descriptors();
    return TEST_ERR_MAJOR_BAD;
  }

  if ((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    close_file_descriptors();
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_HEADER, 1L);

  res = curl_easy_perform(curl);

test_cleanup:

  close_file_descriptors();
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}